

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

ssize_t compress_out(archive_write *a,void *buff,size_t s,la_zaction run)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uLong uVar4;
  size_t s_00;
  uint64_t bytes;
  int r;
  _7zip_conflict *zip;
  la_zaction run_local;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if (((run == ARCHIVE_Z_FINISH) && (*(long *)((long)pvVar1 + 0x98) == 0)) && (s == 0)) {
    a_local = (archive_write *)0x0;
  }
  else {
    if (((*(uint *)((long)pvVar1 + 0x7c) & 1) != 0) && (s != 0)) {
      uVar4 = cm_zlib_crc32((ulong)*(uint *)((long)pvVar1 + 0x74),(uchar *)buff,(uint)s);
      *(int *)((long)pvVar1 + 0x74) = (int)uVar4;
    }
    *(void **)((long)pvVar1 + 0x88) = buff;
    *(size_t *)((long)pvVar1 + 0x90) = s;
LAB_00737363:
    do {
      iVar2 = compression_code(&a->archive,(la_zstream *)((long)pvVar1 + 0x88),run);
      if ((iVar2 != 0) && (iVar2 != 1)) {
        return -0x1e;
      }
      if (*(long *)((long)pvVar1 + 0xa8) == 0) {
        iVar3 = write_to_temp(a,(void *)((long)pvVar1 + 0x108),0xf000);
        if (iVar3 != 0) {
          return -0x1e;
        }
        *(long *)((long)pvVar1 + 0xa0) = (long)pvVar1 + 0x108;
        *(undefined8 *)((long)pvVar1 + 0xa8) = 0xf000;
        if ((*(uint *)((long)pvVar1 + 0x7c) & 2) != 0) {
          uVar4 = cm_zlib_crc32((ulong)*(uint *)((long)pvVar1 + 0x78),
                                (uchar *)((long)pvVar1 + 0x108),0xf000);
          *(int *)((long)pvVar1 + 0x78) = (int)uVar4;
        }
        if ((run == ARCHIVE_Z_FINISH) && (iVar2 != 1)) goto LAB_00737363;
      }
    } while (*(long *)((long)pvVar1 + 0x90) != 0);
    a_local = (archive_write *)s;
    if (run == ARCHIVE_Z_FINISH) {
      s_00 = 0xf000 - *(long *)((long)pvVar1 + 0xa8);
      iVar2 = write_to_temp(a,(void *)((long)pvVar1 + 0x108),s_00);
      if (iVar2 == 0) {
        if (((*(uint *)((long)pvVar1 + 0x7c) & 2) != 0) && (s_00 != 0)) {
          uVar4 = cm_zlib_crc32((ulong)*(uint *)((long)pvVar1 + 0x78),
                                (uchar *)((long)pvVar1 + 0x108),(uint)s_00);
          *(int *)((long)pvVar1 + 0x78) = (int)uVar4;
        }
      }
      else {
        a_local = (archive_write *)0xffffffffffffffe2;
      }
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
compress_out(struct archive_write *a, const void *buff, size_t s,
    enum la_zaction run)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	int r;

	if (run == ARCHIVE_Z_FINISH && zip->stream.total_in == 0 && s == 0)
		return (0);

	if ((zip->crc32flg & PRECODE_CRC32) && s)
		zip->precode_crc32 = crc32(zip->precode_crc32, buff,
		    (unsigned)s);
	zip->stream.next_in = (const unsigned char *)buff;
	zip->stream.avail_in = s;
	for (;;) {
		/* Compress file data. */
		r = compression_code(&(a->archive), &(zip->stream), run);
		if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
			return (ARCHIVE_FATAL);
		if (zip->stream.avail_out == 0) {
			if (write_to_temp(a, zip->wbuff, sizeof(zip->wbuff))
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			zip->stream.next_out = zip->wbuff;
			zip->stream.avail_out = sizeof(zip->wbuff);
			if (zip->crc32flg & ENCODED_CRC32)
				zip->encoded_crc32 = crc32(zip->encoded_crc32,
				    zip->wbuff, sizeof(zip->wbuff));
			if (run == ARCHIVE_Z_FINISH && r != ARCHIVE_EOF)
				continue;
		}
		if (zip->stream.avail_in == 0)
			break;
	}
	if (run == ARCHIVE_Z_FINISH) {
		uint64_t bytes = sizeof(zip->wbuff) - zip->stream.avail_out;
		if (write_to_temp(a, zip->wbuff, (size_t)bytes) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if ((zip->crc32flg & ENCODED_CRC32) && bytes)
			zip->encoded_crc32 = crc32(zip->encoded_crc32,
			    zip->wbuff, (unsigned)bytes);
	}

	return (s);
}